

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetInteger64Verifier::verifyFloat4Color
          (GetInteger64Verifier *this,TestContext *testCtx,GLenum name,GLfloat reference0,
          GLfloat reference1,GLfloat reference2,GLfloat reference3)

{
  deUint64 dVar1;
  deUint64 dVar2;
  ostringstream *this_00;
  bool bVar3;
  long lVar4;
  long lVar5;
  deUint64 dVar6;
  long lVar7;
  deUint64 dVar8;
  long lVar9;
  deUint64 dVar10;
  deUint64 dVar11;
  StateQueryMemoryWriteGuard<long[4]> floatVector4;
  Hex<16UL> local_240;
  TestContext *local_238;
  deUint64 local_230;
  deUint64 local_228;
  deUint64 local_220;
  StateQueryMemoryWriteGuard<long[4]> local_218;
  undefined1 local_1b0 [384];
  
  local_220 = CONCAT44(local_220._4_4_,reference3);
  local_228 = CONCAT44(local_228._4_4_,reference2);
  local_230 = CONCAT44(local_230._4_4_,reference1);
  local_238 = (TestContext *)CONCAT44(local_238._4_4_,reference0);
  local_218.m_postguard[2] = -0x2121212121212122;
  local_218.m_postguard[3] = -0x2121212121212122;
  local_218.m_postguard[0] = -0x2121212121212122;
  local_218.m_postguard[1] = -0x2121212121212122;
  local_218.m_value[2] = 0xdededededededede;
  local_218.m_value[3] = 0xdededededededede;
  local_218.m_value[0] = 0xdededededededede;
  local_218.m_value[1] = 0xdededededededede;
  local_218.m_preguard[2] = -0x2121212121212122;
  local_218.m_preguard[3] = -0x2121212121212122;
  local_218.m_preguard[0] = -0x2121212121212122;
  local_218.m_preguard[1] = -0x2121212121212122;
  glu::CallLogWrapper::glGetInteger64v
            (&(this->super_StateVerifier).super_CallLogWrapper,name,local_218.m_value);
  bVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[4]>::verifyValidity
                    (&local_218,testCtx);
  if (bVar3) {
    lVar5 = (long)((local_238._0_4_ * 4.2949673e+09 + -1.0) * 0.5);
    dVar1 = lVar5 - 0x7ff;
    lVar7 = (long)(((float)local_230 * 4.2949673e+09 + -1.0) * 0.5);
    lVar9 = (long)(((float)local_228 * 4.2949673e+09 + -1.0) * 0.5);
    dVar2 = lVar7 - 0x7ff;
    local_228 = lVar9 - 0x7ff;
    lVar4 = (long)(((float)local_220 * 4.2949673e+09 + -1.0) * 0.5);
    dVar11 = lVar4 - 0x7ff;
    dVar6 = lVar5 + 0x7ff;
    dVar8 = lVar7 + 0x7ff;
    dVar10 = lVar9 + 0x7ff;
    local_230 = lVar4 + 0x7ff;
    if (((((long)dVar6 < local_218.m_value[0] || local_218.m_value[0] < (long)dVar1) ||
         ((long)dVar8 < local_218.m_value[1] || local_218.m_value[1] < (long)dVar2)) ||
        ((long)dVar10 < local_218.m_value[2] || local_218.m_value[2] < (long)local_228)) ||
       (local_218.m_value[3] < (long)dVar11 || (long)local_230 < local_218.m_value[3])) {
      local_1b0._0_8_ = testCtx->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      local_238 = testCtx;
      local_220 = dVar2;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"// ERROR: expected in ranges ",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
      local_240.value = dVar1;
      tcu::Format::Hex<16UL>::toStream(&local_240,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      local_240.value = dVar6;
      tcu::Format::Hex<16UL>::toStream(&local_240,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], ",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
      local_240.value = local_220;
      tcu::Format::Hex<16UL>::toStream(&local_240,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      local_240.value = dVar8;
      tcu::Format::Hex<16UL>::toStream(&local_240,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], ",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
      local_240.value = local_228;
      tcu::Format::Hex<16UL>::toStream(&local_240,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      local_240.value = dVar10;
      tcu::Format::Hex<16UL>::toStream(&local_240,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], ",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
      local_240.value = dVar11;
      tcu::Format::Hex<16UL>::toStream(&local_240,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      local_240.value = local_230;
      tcu::Format::Hex<16UL>::toStream(&local_240,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"; got ",6);
      local_240.value = local_218.m_value[0];
      tcu::Format::Hex<16UL>::toStream(&local_240,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      local_240.value = local_218.m_value[1];
      tcu::Format::Hex<16UL>::toStream(&local_240,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      local_240.value = local_218.m_value[2];
      tcu::Format::Hex<16UL>::toStream(&local_240,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      local_240.value = local_218.m_value[3];
      tcu::Format::Hex<16UL>::toStream(&local_240,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      if (local_238->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(local_238,QP_TEST_RESULT_FAIL,"Got invalid integer value");
      }
    }
  }
  return;
}

Assistant:

void GetInteger64Verifier::verifyFloat4Color (tcu::TestContext& testCtx, GLenum name, GLfloat reference0, GLfloat reference1, GLfloat reference2, GLfloat reference3)
{
	using tcu::TestLog;
	using tcu::toHex;

	const GLint64 referenceAsGLintMin[] =
	{
		expandGLFloatToInteger(reference0) - FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference1) - FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference2) - FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference3) - FLOAT_EXPANSION_E_64
	};
	const GLint64 referenceAsGLintMax[] =
	{
		expandGLFloatToInteger(reference0) + FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference1) + FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference2) + FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference3) + FLOAT_EXPANSION_E_64
	};

	StateQueryMemoryWriteGuard<GLint64[4]> floatVector4;
	glGetInteger64v(name, floatVector4);

	if (!floatVector4.verifyValidity(testCtx))
		return;

	if (floatVector4[0] < referenceAsGLintMin[0] || floatVector4[0] > referenceAsGLintMax[0] ||
		floatVector4[1] < referenceAsGLintMin[1] || floatVector4[1] > referenceAsGLintMax[1] ||
		floatVector4[2] < referenceAsGLintMin[2] || floatVector4[2] > referenceAsGLintMax[2] ||
		floatVector4[3] < referenceAsGLintMin[3] || floatVector4[3] > referenceAsGLintMax[3])
	{
		testCtx.getLog() << TestLog::Message
			<< "// ERROR: expected in ranges "
			<< "[" << toHex(referenceAsGLintMin[0]) << " " << toHex(referenceAsGLintMax[0]) << "], "
			<< "[" << toHex(referenceAsGLintMin[1]) << " " << toHex(referenceAsGLintMax[1]) << "], "
			<< "[" << toHex(referenceAsGLintMin[2]) << " " << toHex(referenceAsGLintMax[2]) << "], "
			<< "[" << toHex(referenceAsGLintMin[3]) << " " << toHex(referenceAsGLintMax[3]) << "]"
			<< "; got "
			<< toHex(floatVector4[0]) << ", "
			<< toHex(floatVector4[1]) << ", "
			<< toHex(floatVector4[2]) << ", "
			<< toHex(floatVector4[3]) << " "<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}